

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<only_assigned_on_reset::AlwaysFFVisitor,_true,_true,_false,_false>::
visit<slang::ast::ConditionalStatement>
          (ASTVisitor<only_assigned_on_reset::AlwaysFFVisitor,_true,_true,_false,_false> *this,
          ConditionalStatement *t)

{
  bool bVar1;
  Statement *in_RSI;
  ConditionalStatement *in_stack_00000098;
  AlwaysFFVisitor *in_stack_000000a0;
  
  bVar1 = Statement::bad(in_RSI);
  if (!bVar1) {
    only_assigned_on_reset::AlwaysFFVisitor::handle(in_stack_000000a0,in_stack_00000098);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }